

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O0

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>::GradX<Fad<double>>
          (TPZGeoBlend<pzgeom::TPZGeoPoint> *this,TPZFMatrix<double> *coord,
          TPZVec<Fad<double>_> *xiInterior,TPZFMatrix<Fad<double>_> *gradx)

{
  bool bVar1;
  int iVar2;
  int64_t iVar3;
  long lVar4;
  TPZFMatrix<Fad<double>_> *side_00;
  TPZFMatrix<Fad<double>_> *xi_00;
  int *piVar5;
  TPZBaseMatrix *in_RCX;
  TPZVec<Fad<double>_> *in_RDX;
  TPZGeoElSideIndex *in_RDI;
  int j_3;
  int i_2;
  int j_2;
  int x_5;
  TPZFMatrix<Fad<double>_> *gradLinSubSide;
  TPZFMatrix<Fad<double>_> *gradNonLinSubSide;
  int xi_2;
  TPZFNMatrix<3,_Fad<double>_> dCorrFactorSideDxiProjMat;
  TPZFNMatrix<3,_Fad<double>_> dCorrFactorSideDxi;
  TPZManVector<Fad<double>,_3> dCorrFactorSideDxiProj;
  Fad<double> blendFactorSide;
  int subSide;
  int subSideIndex;
  TPZStack<int,_10> allContainedSides;
  TPZStack<int,_10> containedNodesInSide;
  int x_4;
  TPZFNMatrix<9,_Fad<double>_> gradNeigh_1;
  TPZManVector<Fad<double>,_3> Xside;
  TPZFNMatrix<9,_Fad<double>_> dNeighXiDXi_1;
  TPZManVector<Fad<double>,_3> neighXi_1;
  int sidedim;
  int iXi;
  TPZManVector<Fad<double>,_3> dCorrFactor;
  int j_1;
  int i_1;
  int xi_1;
  int x_3;
  int x_2;
  int x_1;
  int currentNode;
  int iNode_1;
  TPZFNMatrix<9,_Fad<double>_> gradLinSideXiSide;
  TPZManVector<double,_3> nodeCoord;
  TPZFNMatrix<9,_Fad<double>_> dXiProjectedOverSideDxi;
  TPZFNMatrix<9,_Fad<double>_> dXprojDxiSide;
  TPZFNMatrix<9,_Fad<double>_> dSidePhiDSideXiVec;
  TPZFNMatrix<9,_Fad<double>_> sidePhiVec;
  int sideDim;
  int nSideNodes;
  MElementType sideType;
  bool regularMap;
  TPZFNMatrix<9,_Fad<double>_> transfXiToSideXi;
  TPZManVector<Fad<double>,_3> sideXi;
  TPZGeoElSide gelside;
  int side;
  TPZFMatrix<Fad<double>_> *gradLinSide;
  TPZFMatrix<Fad<double>_> *gradNonLinSide;
  TPZManVector<Fad<double>,_3> xiProjectedOverSide;
  int sideIndex;
  TPZFNMatrix<27,_Fad<double>_> nonLinearSideMappings;
  TPZFNMatrix<27,_Fad<double>_> linearSideMappings;
  TPZFNMatrix<27,_Fad<double>_> dCorrFactorDxi;
  TPZManVector<Fad<double>,_20> blendFactor;
  TPZVec<TPZFMatrix<Fad<double>_>_> gradLinSideVec;
  TPZVec<TPZFMatrix<Fad<double>_>_> gradNonLinSideVec;
  int j;
  int i;
  int xi;
  int x;
  int iNode;
  TPZFNMatrix<45,_Fad<double>_> gradXLin;
  TPZFNMatrix<9,_Fad<double>_> dPhiDxi;
  TPZFNMatrix<9,_Fad<double>_> phi;
  TPZFNMatrix<9,_Fad<double>_> gradNeigh;
  TPZFNMatrix<9,_Fad<double>_> dNeighXiDXi;
  TPZManVector<Fad<double>,_3> neighXi;
  REAL zero;
  TPZGeoMesh *gmesh;
  TPZGeoEl *gel;
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffbed8;
  TPZManVector<double,_3> *in_stack_ffffffffffffbee0;
  TPZGeoMesh *in_stack_ffffffffffffbee8;
  TPZGeoMesh *in_stack_ffffffffffffbef0;
  TPZGeoBlend<pzgeom::TPZGeoPoint> *in_stack_ffffffffffffbef8;
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffbf00;
  Fad<double> *in_stack_ffffffffffffbf08;
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffbf10;
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffbf18;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffbf20;
  Fad<double> *in_stack_ffffffffffffbf28;
  TPZFNMatrix<9,_Fad<double>_> *in_stack_ffffffffffffbf30;
  Fad<double> *in_stack_ffffffffffffbf38;
  TPZFNMatrix<9,_Fad<double>_> *in_stack_ffffffffffffbf40;
  int64_t in_stack_ffffffffffffbf48;
  TPZVec<TPZFMatrix<Fad<double>_>_> *in_stack_ffffffffffffbf50;
  Fad<double> *in_stack_ffffffffffffbf58;
  Fad<double> *in_stack_ffffffffffffbf60;
  Fad<double> *in_stack_ffffffffffffbf68;
  TPZFNMatrix<45,_Fad<double>_> *in_stack_ffffffffffffbf70;
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffbf78;
  TPZManVector<Fad<double>,_3> *in_stack_ffffffffffffbf80;
  TPZGeoBlend<pzgeom::TPZGeoPoint> *in_stack_ffffffffffffbf88;
  undefined7 in_stack_ffffffffffffbf90;
  undefined1 in_stack_ffffffffffffbf97;
  int64_t in_stack_ffffffffffffbfa8;
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffbfb0;
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffbfb8;
  Fad<double> *in_stack_ffffffffffffbfc0;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffc098;
  undefined4 in_stack_ffffffffffffc0a4;
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffc128;
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffc130;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffc138;
  int in_stack_ffffffffffffc144;
  int local_3ea0;
  int local_3e9c;
  int local_3e54;
  int local_3e2c;
  int local_3e18;
  size_t in_stack_ffffffffffffc2f8;
  char *in_stack_ffffffffffffc300;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffc440;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffc448;
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffc450;
  undefined4 in_stack_ffffffffffffc458;
  undefined4 in_stack_ffffffffffffc45c;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffc460;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffc468;
  int in_stack_ffffffffffffc470;
  int in_stack_ffffffffffffc474;
  TPZGeoBlend<pzgeom::TPZGeoPoint> *in_stack_ffffffffffffc478;
  TPZVec<Fad<double>_> local_3b80 [4];
  undefined4 local_3afc;
  int local_3ad8;
  int local_3ad4;
  TPZStack<int,_10> local_3ad0;
  TPZStack<int,_10> local_3a88;
  int local_3a3c;
  undefined8 local_3838;
  TPZVec<Fad<double>_> local_3810 [22];
  int local_353c;
  int local_3538;
  undefined4 local_3534;
  TPZVec<Fad<double>_> local_3510 [5];
  int local_3470;
  int local_346c;
  int local_3448;
  int local_3444;
  int local_341c;
  int local_33f8;
  int local_33f4;
  int local_33f0;
  undefined4 local_33ec;
  TPZVec<double> local_31f8;
  undefined4 local_31bc;
  undefined4 local_2fc4;
  int local_2a30;
  int local_2a2c;
  MElementType local_2a28;
  undefined1 local_2a21;
  undefined4 local_27d0;
  undefined4 local_27cc;
  TPZGeoElSide local_27c8;
  int local_27ac;
  TPZFMatrix<Fad<double>_> *local_27a8;
  TPZFMatrix<Fad<double>_> *local_27a0;
  undefined4 local_2794;
  TPZVec<Fad<double>_> local_2770 [4];
  int local_26ec;
  undefined8 local_26e8;
  undefined8 local_22b0;
  undefined4 local_1e74;
  undefined4 local_1a3c;
  TPZVec<Fad<double>_> local_1a18 [21];
  undefined4 local_1774;
  TPZVec<TPZFMatrix<Fad<double>_>_> local_1340;
  undefined4 local_131c;
  TPZVec<TPZFMatrix<Fad<double>_>_> local_ee8;
  int local_ec8;
  int local_ec4;
  int local_ea0;
  int local_e9c;
  int local_e98;
  undefined4 local_e94;
  undefined8 local_38;
  TPZGeoMesh *local_30;
  TPZGeoEl *local_28;
  TPZBaseMatrix *local_20;
  TPZVec<Fad<double>_> *local_18;
  
  local_28 = *(TPZGeoEl **)&in_RDI->fSide;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_30 = TPZGeoEl::Mesh(local_28);
  local_38 = 0x3d06849b86a12b9b;
  (*(local_20->super_TPZSavable)._vptr_TPZSavable[0xe])(local_20,3,0);
  iVar3 = TPZGeoElSideIndex::ElementIndex(in_RDI);
  iVar2 = (int)((ulong)in_stack_ffffffffffffbfa8 >> 0x20);
  if (iVar3 == -1) {
    TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
              (in_stack_ffffffffffffbf40,(int64_t)in_stack_ffffffffffffbf38,
               (int64_t)in_stack_ffffffffffffbf30);
    TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
              (in_stack_ffffffffffffbf40,(int64_t)in_stack_ffffffffffffbf38,
               (int64_t)in_stack_ffffffffffffbf30);
    pztopology::TPZPoint::TShape<Fad<double>>
              (in_stack_ffffffffffffbf20,in_stack_ffffffffffffbf18,in_stack_ffffffffffffbf10);
    local_e94 = 0;
    Fad<double>::Fad<int,_nullptr>
              ((Fad<double> *)in_stack_ffffffffffffbef0,(int *)in_stack_ffffffffffffbee8);
    TPZFNMatrix<45,_Fad<double>_>::TPZFNMatrix
              (in_stack_ffffffffffffbf70,(int64_t)in_stack_ffffffffffffbf68,
               (int64_t)in_stack_ffffffffffffbf60,in_stack_ffffffffffffbf58);
    Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffbee0);
    for (local_e98 = 0; local_e98 < 1; local_e98 = local_e98 + 1) {
      for (local_e9c = 0; local_e9c < 3; local_e9c = local_e9c + 1) {
        for (local_ea0 = 0; local_ea0 < 0; local_ea0 = local_ea0 + 1) {
          TPZFMatrix<double>::operator()
                    ((TPZFMatrix<double> *)in_stack_ffffffffffffbf00,
                     (int64_t)in_stack_ffffffffffffbef8,(int64_t)in_stack_ffffffffffffbef0);
          TPZFMatrix<Fad<double>_>::operator()
                    (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                     (int64_t)in_stack_ffffffffffffbef0);
          operator*<double,_Fad<double>,_nullptr>
                    ((double)in_stack_ffffffffffffbf28,(Fad<double> *)in_stack_ffffffffffffbf20);
          TPZFMatrix<Fad<double>_>::operator()
                    (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                     (int64_t)in_stack_ffffffffffffbef0);
          Fad<double>::operator+=
                    ((Fad<double> *)in_stack_ffffffffffffbf10,
                     (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
                     in_stack_ffffffffffffbf08);
          FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                    ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
                     in_stack_ffffffffffffbee0);
        }
      }
    }
    for (local_ec4 = 0; lVar4 = (long)local_ec4, iVar3 = TPZBaseMatrix::Rows(local_20),
        lVar4 < iVar3; local_ec4 = local_ec4 + 1) {
      for (local_ec8 = 0; lVar4 = (long)local_ec8, iVar3 = TPZBaseMatrix::Cols(local_20),
          lVar4 < iVar3; local_ec8 = local_ec8 + 1) {
        TPZFMatrix<Fad<double>_>::operator()
                  (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                   (int64_t)in_stack_ffffffffffffbef0);
        TPZFMatrix<Fad<double>_>::operator()
                  (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                   (int64_t)in_stack_ffffffffffffbef0);
        Fad<double>::operator=
                  ((Fad<double> *)in_stack_ffffffffffffbee0,(Fad<double> *)in_stack_ffffffffffffbed8
                  );
      }
    }
    local_131c = 0;
    Fad<double>::Fad<int,_nullptr>
              ((Fad<double> *)in_stack_ffffffffffffbef0,(int *)in_stack_ffffffffffffbee8);
    TPZFNMatrix<27,_Fad<double>_>::TPZFNMatrix
              ((TPZFNMatrix<27,_Fad<double>_> *)in_stack_ffffffffffffbf70,
               (int64_t)in_stack_ffffffffffffbf68,(int64_t)in_stack_ffffffffffffbf60,
               in_stack_ffffffffffffbf58);
    TPZVec<TPZFMatrix<Fad<double>_>_>::TPZVec
              (in_stack_ffffffffffffbf50,in_stack_ffffffffffffbf48,
               &in_stack_ffffffffffffbf40->super_TPZFMatrix<Fad<double>_>);
    TPZFNMatrix<27,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<27,_Fad<double>_> *)0x16688a2);
    Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffbee0);
    local_1774 = 0;
    Fad<double>::Fad<int,_nullptr>
              ((Fad<double> *)in_stack_ffffffffffffbef0,(int *)in_stack_ffffffffffffbee8);
    TPZFNMatrix<27,_Fad<double>_>::TPZFNMatrix
              ((TPZFNMatrix<27,_Fad<double>_> *)in_stack_ffffffffffffbf70,
               (int64_t)in_stack_ffffffffffffbf68,(int64_t)in_stack_ffffffffffffbf60,
               in_stack_ffffffffffffbf58);
    TPZVec<TPZFMatrix<Fad<double>_>_>::TPZVec
              (in_stack_ffffffffffffbf50,in_stack_ffffffffffffbf48,
               &in_stack_ffffffffffffbf40->super_TPZFMatrix<Fad<double>_>);
    TPZFNMatrix<27,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<27,_Fad<double>_> *)0x1668919);
    Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffbee0);
    local_1a3c = 0;
    Fad<double>::Fad<int,_nullptr>
              ((Fad<double> *)in_stack_ffffffffffffbef0,(int *)in_stack_ffffffffffffbee8);
    TPZManVector<Fad<double>,_20>::TPZManVector
              ((TPZManVector<Fad<double>,_20> *)
               CONCAT17(in_stack_ffffffffffffbf97,in_stack_ffffffffffffbf90),
               (int64_t)in_stack_ffffffffffffbf88,(Fad<double> *)in_stack_ffffffffffffbf80);
    Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffbee0);
    local_1e74 = 0;
    Fad<double>::Fad<int,_nullptr>
              ((Fad<double> *)in_stack_ffffffffffffbef0,(int *)in_stack_ffffffffffffbee8);
    TPZFNMatrix<27,_Fad<double>_>::TPZFNMatrix
              ((TPZFNMatrix<27,_Fad<double>_> *)in_stack_ffffffffffffbf70,
               (int64_t)in_stack_ffffffffffffbf68,(int64_t)in_stack_ffffffffffffbf60,
               in_stack_ffffffffffffbf58);
    Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffbee0);
    local_22b0 = 0;
    Fad<double>::Fad<double,_nullptr>
              ((Fad<double> *)in_stack_ffffffffffffbef0,(double *)in_stack_ffffffffffffbee8);
    TPZFNMatrix<27,_Fad<double>_>::TPZFNMatrix
              ((TPZFNMatrix<27,_Fad<double>_> *)in_stack_ffffffffffffbf70,
               (int64_t)in_stack_ffffffffffffbf68,(int64_t)in_stack_ffffffffffffbf60,
               in_stack_ffffffffffffbf58);
    Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffbee0);
    local_26e8 = 0;
    Fad<double>::Fad<double,_nullptr>
              ((Fad<double> *)in_stack_ffffffffffffbef0,(double *)in_stack_ffffffffffffbee8);
    TPZFNMatrix<27,_Fad<double>_>::TPZFNMatrix
              ((TPZFNMatrix<27,_Fad<double>_> *)in_stack_ffffffffffffbf70,
               (int64_t)in_stack_ffffffffffffbf68,(int64_t)in_stack_ffffffffffffbf60,
               in_stack_ffffffffffffbf58);
    Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffbee0);
    for (local_26ec = 0; local_26ec < -1; local_26ec = local_26ec + 1) {
      local_2794 = 0;
      Fad<double>::Fad<int,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffbef0,(int *)in_stack_ffffffffffffbee8);
      TPZManVector<Fad<double>,_3>::TPZManVector
                ((TPZManVector<Fad<double>,_3> *)
                 CONCAT17(in_stack_ffffffffffffbf97,in_stack_ffffffffffffbf90),
                 (int64_t)in_stack_ffffffffffffbf88,(Fad<double> *)in_stack_ffffffffffffbf80);
      Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffbee0);
      side_00 = TPZVec<TPZFMatrix<Fad<double>_>_>::operator[](&local_ee8,(long)local_26ec);
      local_27a0 = side_00;
      xi_00 = TPZVec<TPZFMatrix<Fad<double>_>_>::operator[](&local_1340,(long)local_26ec);
      local_27a8 = xi_00;
      (*(xi_00->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0xe])(xi_00,3,0);
      (*(local_27a0->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0xe])(local_27a0,3,0);
      local_27ac = local_26ec + 1;
      TPZGeoElSide::TPZGeoElSide
                ((TPZGeoElSide *)in_stack_ffffffffffffbf00,
                 (TPZGeoElSideIndex *)in_stack_ffffffffffffbef8,in_stack_ffffffffffffbef0);
      bVar1 = IsLinearMapping(in_stack_ffffffffffffbf88,
                              (int)((ulong)in_stack_ffffffffffffbf80 >> 0x20));
      in_stack_ffffffffffffc0a4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffc0a4);
      if ((bVar1) || (iVar2 = TPZGeoElSide::Exists(&local_27c8), iVar2 == 0)) {
        local_27cc = 0;
        in_stack_ffffffffffffc098 =
             (TPZVec<Fad<double>_> *)TPZVec<Fad<double>_>::operator[](local_1a18,(long)local_26ec);
        Fad<double>::operator=<int,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffbef0,(int *)in_stack_ffffffffffffbee8);
        local_27d0 = 0x13;
      }
      else {
        TPZManVector<Fad<double>,_3>::TPZManVector
                  (in_stack_ffffffffffffbf80,(int64_t)in_stack_ffffffffffffbf78);
        TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(in_stack_ffffffffffffbf30);
        local_2a21 = pztopology::TPZPoint::CheckProjectionForSingularity<Fad<double>>
                               (&local_27ac,local_18);
        if ((bool)local_2a21) {
          pztopology::TPZPoint::MapToSide<Fad<double>>
                    ((int)((ulong)in_stack_ffffffffffffbef0 >> 0x20),
                     (TPZVec<Fad<double>_> *)in_stack_ffffffffffffbee8,
                     (TPZVec<Fad<double>_> *)in_stack_ffffffffffffbee0,in_stack_ffffffffffffbed8);
          local_2a28 = pztopology::TPZPoint::Type(local_27ac);
          local_2a2c = MElementType_NNodes((MElementType)in_stack_ffffffffffffbee0);
          local_2a30 = pztopology::TPZPoint::SideDimension(local_27ac);
          TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
                    (in_stack_ffffffffffffbf40,(int64_t)in_stack_ffffffffffffbf38,
                     (int64_t)in_stack_ffffffffffffbf30);
          TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
                    (in_stack_ffffffffffffbf40,(int64_t)in_stack_ffffffffffffbf38,
                     (int64_t)in_stack_ffffffffffffbf30);
          GetSideShapeFunction<pzgeom::TPZGeoPoint>
                    (in_stack_ffffffffffffc144,in_stack_ffffffffffffc138,in_stack_ffffffffffffc130,
                     in_stack_ffffffffffffc128);
          local_2fc4 = 0;
          Fad<double>::Fad<int,_nullptr>
                    ((Fad<double> *)in_stack_ffffffffffffbef0,(int *)in_stack_ffffffffffffbee8);
          TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
                    ((TPZFNMatrix<9,_Fad<double>_> *)in_stack_ffffffffffffbf70,
                     (int64_t)in_stack_ffffffffffffbf68,(int64_t)in_stack_ffffffffffffbf60,
                     in_stack_ffffffffffffbf58);
          Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffbee0);
          local_31bc = 0;
          Fad<double>::Fad<int,_nullptr>
                    ((Fad<double> *)in_stack_ffffffffffffbef0,(int *)in_stack_ffffffffffffbee8);
          TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
                    ((TPZFNMatrix<9,_Fad<double>_> *)in_stack_ffffffffffffbf70,
                     (int64_t)in_stack_ffffffffffffbf68,(int64_t)in_stack_ffffffffffffbf60,
                     in_stack_ffffffffffffbf58);
          Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffbee0);
          TPZManVector<double,_3>::TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_ffffffffffffbf00,
                     (int64_t)in_stack_ffffffffffffbef8);
          local_33ec = 0;
          Fad<double>::Fad<int,_nullptr>
                    ((Fad<double> *)in_stack_ffffffffffffbef0,(int *)in_stack_ffffffffffffbee8);
          TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
                    ((TPZFNMatrix<9,_Fad<double>_> *)in_stack_ffffffffffffbf70,
                     (int64_t)in_stack_ffffffffffffbf68,(int64_t)in_stack_ffffffffffffbf60,
                     in_stack_ffffffffffffbf58);
          Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffbee0);
          for (local_33f0 = 0; local_33f0 < local_2a2c; local_33f0 = local_33f0 + 1) {
            local_33f4 = pztopology::TPZPoint::SideNodeLocId(local_27ac,local_33f0);
            for (local_33f8 = 0; local_33f8 < 3; local_33f8 = local_33f8 + 1) {
              TPZFMatrix<double>::operator()
                        ((TPZFMatrix<double> *)in_stack_ffffffffffffbf00,
                         (int64_t)in_stack_ffffffffffffbef8,(int64_t)in_stack_ffffffffffffbef0);
              TPZFMatrix<Fad<double>_>::operator()
                        (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                         (int64_t)in_stack_ffffffffffffbef0);
              operator*<double,_Fad<double>,_nullptr>
                        ((double)in_stack_ffffffffffffbf28,(Fad<double> *)in_stack_ffffffffffffbf20)
              ;
              TPZFMatrix<Fad<double>_>::operator()
                        (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                         (int64_t)in_stack_ffffffffffffbef0);
              Fad<double>::operator+=
                        ((Fad<double> *)in_stack_ffffffffffffbf10,
                         (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
                         in_stack_ffffffffffffbf08);
              FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                        ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
                         in_stack_ffffffffffffbee0);
            }
            pztopology::TPZPoint::ParametricDomainNodeCoord
                      ((int)((ulong)in_stack_ffffffffffffbee0 >> 0x20),
                       (TPZVec<double> *)in_stack_ffffffffffffbed8);
            for (local_341c = 0; local_341c < 0; local_341c = local_341c + 1) {
              TPZVec<double>::operator[](&local_31f8,(long)local_341c);
              TPZFMatrix<Fad<double>_>::operator()
                        (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                         (int64_t)in_stack_ffffffffffffbef0);
              operator*<double,_Fad<double>,_nullptr>
                        ((double)in_stack_ffffffffffffbf28,(Fad<double> *)in_stack_ffffffffffffbf20)
              ;
              TPZVec<Fad<double>_>::operator[](local_2770,(long)local_341c);
              Fad<double>::operator+=
                        ((Fad<double> *)in_stack_ffffffffffffbf10,
                         (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
                         in_stack_ffffffffffffbf08);
              FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                        ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
                         in_stack_ffffffffffffbee0);
            }
            for (local_3444 = 0; local_3444 < 3; local_3444 = local_3444 + 1) {
              for (local_3448 = 0; local_3448 < local_2a30; local_3448 = local_3448 + 1) {
                TPZFMatrix<double>::operator()
                          ((TPZFMatrix<double> *)in_stack_ffffffffffffbf00,
                           (int64_t)in_stack_ffffffffffffbef8,(int64_t)in_stack_ffffffffffffbef0);
                TPZFMatrix<Fad<double>_>::operator()
                          (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                           (int64_t)in_stack_ffffffffffffbef0);
                operator*<double,_Fad<double>,_nullptr>
                          ((double)in_stack_ffffffffffffbf28,
                           (Fad<double> *)in_stack_ffffffffffffbf20);
                TPZFMatrix<Fad<double>_>::operator()
                          (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                           (int64_t)in_stack_ffffffffffffbef0);
                Fad<double>::operator+=
                          ((Fad<double> *)in_stack_ffffffffffffbf10,
                           (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
                           in_stack_ffffffffffffbf08);
                FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                          ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
                           in_stack_ffffffffffffbee0);
              }
            }
            for (local_346c = 0; local_346c < 0; local_346c = local_346c + 1) {
              for (local_3470 = 0; local_3470 < local_2a30; local_3470 = local_3470 + 1) {
                TPZVec<double>::operator[](&local_31f8,(long)local_346c);
                TPZFMatrix<Fad<double>_>::operator()
                          (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                           (int64_t)in_stack_ffffffffffffbef0);
                operator*<double,_Fad<double>,_nullptr>
                          ((double)in_stack_ffffffffffffbf28,
                           (Fad<double> *)in_stack_ffffffffffffbf20);
                TPZFMatrix<Fad<double>_>::operator()
                          (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                           (int64_t)in_stack_ffffffffffffbef0);
                Fad<double>::operator+=
                          ((Fad<double> *)in_stack_ffffffffffffbf10,
                           (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
                           in_stack_ffffffffffffbf08);
                FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                          ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
                           in_stack_ffffffffffffbee0);
              }
            }
          }
          TPZMatrix<Fad<double>_>::Multiply
                    ((TPZMatrix<Fad<double>_> *)in_stack_ffffffffffffbfc0,in_stack_ffffffffffffbfb8,
                     in_stack_ffffffffffffbfb0,(int)((ulong)in_stack_ffffffffffffbfa8 >> 0x20));
          TPZMatrix<Fad<double>_>::Multiply
                    ((TPZMatrix<Fad<double>_> *)in_stack_ffffffffffffbfc0,in_stack_ffffffffffffbfb8,
                     in_stack_ffffffffffffbfb0,(int)((ulong)in_stack_ffffffffffffbfa8 >> 0x20));
          local_3534 = 0;
          Fad<double>::Fad<int,_nullptr>
                    ((Fad<double> *)in_stack_ffffffffffffbef0,(int *)in_stack_ffffffffffffbee8);
          TPZManVector<Fad<double>,_3>::TPZManVector
                    ((TPZManVector<Fad<double>,_3> *)
                     CONCAT17(in_stack_ffffffffffffbf97,in_stack_ffffffffffffbf90),
                     (int64_t)in_stack_ffffffffffffbf88,(Fad<double> *)in_stack_ffffffffffffbf80);
          Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffbee0);
          TPZVec<Fad<double>_>::operator[](local_1a18,(long)local_26ec);
          pztopology::TPZPoint::BlendFactorForSide<Fad<double>>
                    ((int *)side_00,(TPZVec<Fad<double>_> *)xi_00,
                     (Fad<double> *)CONCAT44(in_stack_ffffffffffffc0a4,iVar2),
                     in_stack_ffffffffffffc098);
          for (local_3538 = 0; local_3538 < 0; local_3538 = local_3538 + 1) {
            TPZVec<Fad<double>_>::operator[](local_3510,(long)local_3538);
            TPZFMatrix<Fad<double>_>::operator()
                      (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                       (int64_t)in_stack_ffffffffffffbef0);
            Fad<double>::operator=
                      ((Fad<double> *)in_stack_ffffffffffffbee0,
                       (Fad<double> *)in_stack_ffffffffffffbed8);
          }
          TPZManVector<Fad<double>,_3>::~TPZManVector
                    ((TPZManVector<Fad<double>,_3> *)in_stack_ffffffffffffbef0);
          local_353c = TPZGeoElSide::Dimension((TPZGeoElSide *)in_stack_ffffffffffffbee0);
          TPZManVector<Fad<double>,_3>::TPZManVector
                    (in_stack_ffffffffffffbf80,(int64_t)in_stack_ffffffffffffbf78);
          TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(in_stack_ffffffffffffbf30);
          bVar1 = MapToNeighSide<Fad<double>>
                            (in_stack_ffffffffffffc478,in_stack_ffffffffffffc474,
                             in_stack_ffffffffffffc470,in_stack_ffffffffffffc468,
                             in_stack_ffffffffffffc460,
                             (TPZFMatrix<Fad<double>_> *)
                             CONCAT44(in_stack_ffffffffffffc45c,in_stack_ffffffffffffc458));
          if (bVar1) {
            local_3838 = 0;
            Fad<double>::Fad<double,_nullptr>
                      ((Fad<double> *)in_stack_ffffffffffffbef0,(double *)in_stack_ffffffffffffbee8)
            ;
            TPZManVector<Fad<double>,_3>::TPZManVector
                      ((TPZManVector<Fad<double>,_3> *)
                       CONCAT17(in_stack_ffffffffffffbf97,in_stack_ffffffffffffbf90),
                       (int64_t)in_stack_ffffffffffffbf88,(Fad<double> *)in_stack_ffffffffffffbf80);
            Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffbee0);
            Neighbour(in_stack_ffffffffffffbef8,(int)((ulong)in_stack_ffffffffffffbef0 >> 0x20),
                      in_stack_ffffffffffffbee8);
            TPZGeoElSide::X((TPZGeoElSide *)in_stack_ffffffffffffc450,in_stack_ffffffffffffc448,
                            in_stack_ffffffffffffc440);
            TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1669aa1);
            TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(in_stack_ffffffffffffbf30);
            Neighbour(in_stack_ffffffffffffbef8,(int)((ulong)in_stack_ffffffffffffbef0 >> 0x20),
                      in_stack_ffffffffffffbee8);
            TPZGeoElSide::GradX((TPZGeoElSide *)in_stack_ffffffffffffc460,
                                (TPZVec<Fad<double>_> *)
                                CONCAT44(in_stack_ffffffffffffc45c,in_stack_ffffffffffffc458),
                                in_stack_ffffffffffffc450);
            TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1669b02);
            for (local_3a3c = 0; local_3a3c < 3; local_3a3c = local_3a3c + 1) {
              in_stack_ffffffffffffbfc0 =
                   TPZVec<Fad<double>_>::operator[](local_3810,(long)local_3a3c);
              in_stack_ffffffffffffbfb8 =
                   (TPZFMatrix<Fad<double>_> *)
                   TPZFMatrix<Fad<double>_>::operator()
                             (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                              (int64_t)in_stack_ffffffffffffbef0);
              Fad<double>::operator=
                        ((Fad<double> *)in_stack_ffffffffffffbee0,
                         (Fad<double> *)in_stack_ffffffffffffbed8);
            }
            TPZMatrix<Fad<double>_>::Multiply
                      ((TPZMatrix<Fad<double>_> *)in_stack_ffffffffffffbfc0,
                       in_stack_ffffffffffffbfb8,in_stack_ffffffffffffbfb0,
                       (int)((ulong)in_stack_ffffffffffffbfa8 >> 0x20));
            TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)in_stack_ffffffffffffbef0);
            pztopology::TPZPoint::LowerDimensionSides(local_27ac,&local_3a88,0);
            TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)in_stack_ffffffffffffbef0);
            pztopology::TPZPoint::LowerDimensionSides(local_27ac,&local_3ad0);
            in_stack_ffffffffffffbfb0 =
                 (TPZFMatrix<Fad<double>_> *)TPZVec<int>::NElements((TPZVec<int> *)&local_3a88);
            for (local_3ad4 = (int)in_stack_ffffffffffffbfb0; lVar4 = (long)local_3ad4,
                in_stack_ffffffffffffbfa8 = TPZVec<int>::NElements((TPZVec<int> *)&local_3ad0),
                lVar4 < in_stack_ffffffffffffbfa8; local_3ad4 = local_3ad4 + 1) {
              piVar5 = TPZVec<int>::operator[]((TPZVec<int> *)&local_3ad0,(long)local_3ad4);
              local_3ad8 = *piVar5;
              in_stack_ffffffffffffbf97 =
                   IsLinearMapping(in_stack_ffffffffffffbf88,
                                   (int)((ulong)in_stack_ffffffffffffbf80 >> 0x20));
              if (!(bool)in_stack_ffffffffffffbf97) {
                local_3afc = 0xffffffff;
                Fad<double>::Fad<int,_nullptr>
                          ((Fad<double> *)in_stack_ffffffffffffbef0,(int *)in_stack_ffffffffffffbee8
                          );
                in_stack_ffffffffffffc45c = 0;
                Fad<double>::Fad<int,_nullptr>
                          ((Fad<double> *)in_stack_ffffffffffffbef0,(int *)in_stack_ffffffffffffbee8
                          );
                TPZManVector<Fad<double>,_3>::TPZManVector
                          ((TPZManVector<Fad<double>,_3> *)
                           CONCAT17(in_stack_ffffffffffffbf97,in_stack_ffffffffffffbf90),
                           (int64_t)in_stack_ffffffffffffbf88,
                           (Fad<double> *)in_stack_ffffffffffffbf80);
                Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffbee0);
                Fad<double>::Fad<int,_nullptr>
                          ((Fad<double> *)in_stack_ffffffffffffbef0,(int *)in_stack_ffffffffffffbee8
                          );
                TPZFNMatrix<3,_Fad<double>_>::TPZFNMatrix
                          ((TPZFNMatrix<3,_Fad<double>_> *)in_stack_ffffffffffffbf70,
                           (int64_t)in_stack_ffffffffffffbf68,(int64_t)in_stack_ffffffffffffbf60,
                           in_stack_ffffffffffffbf58);
                Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffbee0);
                pztopology::TPZPoint::BlendFactorForSide<Fad<double>>
                          ((int *)side_00,(TPZVec<Fad<double>_> *)xi_00,
                           (Fad<double> *)CONCAT44(in_stack_ffffffffffffc0a4,iVar2),
                           in_stack_ffffffffffffc098);
                Fad<double>::Fad<int,_nullptr>
                          ((Fad<double> *)in_stack_ffffffffffffbef0,(int *)in_stack_ffffffffffffbee8
                          );
                TPZFNMatrix<3,_Fad<double>_>::TPZFNMatrix
                          ((TPZFNMatrix<3,_Fad<double>_> *)in_stack_ffffffffffffbf70,
                           (int64_t)in_stack_ffffffffffffbf68,(int64_t)in_stack_ffffffffffffbf60,
                           in_stack_ffffffffffffbf58);
                Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffbee0);
                for (local_3e18 = 0; local_3e18 < 0; local_3e18 = local_3e18 + 1) {
                  in_stack_ffffffffffffbf88 =
                       (TPZGeoBlend<pzgeom::TPZGeoPoint> *)
                       TPZVec<Fad<double>_>::operator[](local_3b80,(long)local_3e18);
                  in_stack_ffffffffffffbf80 =
                       (TPZManVector<Fad<double>,_3> *)
                       TPZFMatrix<Fad<double>_>::operator()
                                 (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                                  (int64_t)in_stack_ffffffffffffbef0);
                  Fad<double>::operator=
                            ((Fad<double> *)in_stack_ffffffffffffbee0,
                             (Fad<double> *)in_stack_ffffffffffffbed8);
                }
                TPZMatrix<Fad<double>_>::Multiply
                          ((TPZMatrix<Fad<double>_> *)in_stack_ffffffffffffbfc0,
                           in_stack_ffffffffffffbfb8,in_stack_ffffffffffffbfb0,
                           (int)((ulong)in_stack_ffffffffffffbfa8 >> 0x20));
                in_stack_ffffffffffffbf78 =
                     TPZVec<TPZFMatrix<Fad<double>_>_>::operator[]
                               (&local_ee8,(long)(local_3ad8 + -1));
                in_stack_ffffffffffffbf70 =
                     (TPZFNMatrix<45,_Fad<double>_> *)
                     TPZVec<TPZFMatrix<Fad<double>_>_>::operator[]
                               (&local_1340,(long)(local_3ad8 + -1));
                for (local_3e2c = 0; local_3e2c < 3; local_3e2c = local_3e2c + 1) {
                  in_stack_ffffffffffffbf68 =
                       TPZFMatrix<Fad<double>_>::operator()
                                 (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                                  (int64_t)in_stack_ffffffffffffbef0);
                  in_stack_ffffffffffffbf60 =
                       TPZFMatrix<Fad<double>_>::operator()
                                 (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                                  (int64_t)in_stack_ffffffffffffbef0);
                  operator-<Fad<double>,_Fad<double>,_nullptr>
                            ((Fad<double> *)in_stack_ffffffffffffbf18,
                             (Fad<double> *)in_stack_ffffffffffffbf10);
                  operator*<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_nullptr>
                            ((Fad<double> *)in_stack_ffffffffffffbf18,
                             (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)
                             in_stack_ffffffffffffbf10);
                  in_stack_ffffffffffffbf58 =
                       TPZFMatrix<Fad<double>_>::operator()
                                 (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                                  (int64_t)in_stack_ffffffffffffbef0);
                  Fad<double>::operator-=
                            ((Fad<double> *)in_stack_ffffffffffffbf10,
                             (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                              *)in_stack_ffffffffffffbf08);
                  FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                  ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                              *)in_stack_ffffffffffffbee0);
                  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
                            ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)
                             in_stack_ffffffffffffbee0);
                  for (local_3e54 = 0; local_3e54 < 0; local_3e54 = local_3e54 + 1) {
                    TPZFMatrix<Fad<double>_>::operator()
                              (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                               (int64_t)in_stack_ffffffffffffbef0);
                    TPZFMatrix<Fad<double>_>::operator()
                              (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                               (int64_t)in_stack_ffffffffffffbef0);
                    operator-<Fad<double>,_Fad<double>,_nullptr>
                              ((Fad<double> *)in_stack_ffffffffffffbf18,
                               (Fad<double> *)in_stack_ffffffffffffbf10);
                    operator*<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_nullptr>
                              ((Fad<double> *)in_stack_ffffffffffffbf18,
                               (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)
                               in_stack_ffffffffffffbf10);
                    in_stack_ffffffffffffbf40 =
                         (TPZFNMatrix<9,_Fad<double>_> *)
                         TPZFMatrix<Fad<double>_>::operator()
                                   (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                                    (int64_t)in_stack_ffffffffffffbef0);
                    Fad<double>::operator-=
                              ((Fad<double> *)in_stack_ffffffffffffbf10,
                               (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                                *)in_stack_ffffffffffffbf08);
                    FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                    ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                                *)in_stack_ffffffffffffbee0);
                    FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
                              ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)
                               in_stack_ffffffffffffbee0);
                    in_stack_ffffffffffffbf38 =
                         TPZFMatrix<Fad<double>_>::operator()
                                   (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                                    (int64_t)in_stack_ffffffffffffbef0);
                    in_stack_ffffffffffffbf30 =
                         (TPZFNMatrix<9,_Fad<double>_> *)
                         TPZFMatrix<Fad<double>_>::operator()
                                   (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                                    (int64_t)in_stack_ffffffffffffbef0);
                    in_stack_ffffffffffffbf28 =
                         TPZFMatrix<Fad<double>_>::operator()
                                   (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                                    (int64_t)in_stack_ffffffffffffbef0);
                    operator-<Fad<double>,_Fad<double>,_nullptr>
                              ((Fad<double> *)in_stack_ffffffffffffbf18,
                               (Fad<double> *)in_stack_ffffffffffffbf10);
                    operator*<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_nullptr>
                              ((Fad<double> *)in_stack_ffffffffffffbf18,
                               (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)
                               in_stack_ffffffffffffbf10);
                    in_stack_ffffffffffffbf20 =
                         (TPZVec<Fad<double>_> *)
                         TPZFMatrix<Fad<double>_>::operator()
                                   (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                                    (int64_t)in_stack_ffffffffffffbef0);
                    Fad<double>::operator-=
                              ((Fad<double> *)in_stack_ffffffffffffbf10,
                               (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                                *)in_stack_ffffffffffffbf08);
                    FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                    ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                                *)in_stack_ffffffffffffbee0);
                    FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
                              ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)
                               in_stack_ffffffffffffbee0);
                  }
                }
                TPZFNMatrix<3,_Fad<double>_>::~TPZFNMatrix
                          ((TPZFNMatrix<3,_Fad<double>_> *)0x166a4ac);
                TPZFNMatrix<3,_Fad<double>_>::~TPZFNMatrix
                          ((TPZFNMatrix<3,_Fad<double>_> *)0x166a4b9);
                TPZManVector<Fad<double>,_3>::~TPZManVector
                          ((TPZManVector<Fad<double>,_3> *)in_stack_ffffffffffffbef0);
                Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffbee0);
              }
            }
            for (local_3e9c = 0; local_3e9c < 3; local_3e9c = local_3e9c + 1) {
              for (local_3ea0 = 0; local_3ea0 < 0; local_3ea0 = local_3ea0 + 1) {
                in_stack_ffffffffffffbf18 =
                     (TPZFMatrix<Fad<double>_> *)
                     TPZVec<Fad<double>_>::operator[](local_1a18,(long)local_26ec);
                in_stack_ffffffffffffbf10 =
                     (TPZFMatrix<Fad<double>_> *)
                     TPZFMatrix<Fad<double>_>::operator()
                               (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                                (int64_t)in_stack_ffffffffffffbef0);
                in_stack_ffffffffffffbf08 =
                     TPZFMatrix<Fad<double>_>::operator()
                               (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                                (int64_t)in_stack_ffffffffffffbef0);
                operator-<Fad<double>,_Fad<double>,_nullptr>
                          ((Fad<double> *)in_stack_ffffffffffffbf18,
                           (Fad<double> *)in_stack_ffffffffffffbf10);
                operator*<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_nullptr>
                          ((Fad<double> *)in_stack_ffffffffffffbf18,
                           (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)
                           in_stack_ffffffffffffbf10);
                in_stack_ffffffffffffbf00 =
                     (TPZFMatrix<Fad<double>_> *)
                     TPZFMatrix<Fad<double>_>::operator()
                               (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                                (int64_t)in_stack_ffffffffffffbef0);
                Fad<double>::operator+=
                          ((Fad<double> *)in_stack_ffffffffffffbf10,
                           (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                            *)in_stack_ffffffffffffbf08);
                FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                            *)in_stack_ffffffffffffbee0);
                FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
                          ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)
                           in_stack_ffffffffffffbee0);
                in_stack_ffffffffffffbef8 =
                     (TPZGeoBlend<pzgeom::TPZGeoPoint> *)
                     TPZFMatrix<Fad<double>_>::operator()
                               (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                                (int64_t)in_stack_ffffffffffffbef0);
                in_stack_ffffffffffffbef0 =
                     (TPZGeoMesh *)
                     TPZFMatrix<Fad<double>_>::operator()
                               (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                                (int64_t)in_stack_ffffffffffffbef0);
                in_stack_ffffffffffffbee8 =
                     (TPZGeoMesh *)
                     TPZFMatrix<Fad<double>_>::operator()
                               (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                                (int64_t)in_stack_ffffffffffffbef0);
                operator-<Fad<double>,_Fad<double>,_nullptr>
                          ((Fad<double> *)in_stack_ffffffffffffbf18,
                           (Fad<double> *)in_stack_ffffffffffffbf10);
                operator*<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_nullptr>
                          ((Fad<double> *)in_stack_ffffffffffffbf18,
                           (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)
                           in_stack_ffffffffffffbf10);
                in_stack_ffffffffffffbee0 =
                     (TPZManVector<double,_3> *)
                     TPZFMatrix<Fad<double>_>::operator()
                               (in_stack_ffffffffffffbf00,(int64_t)in_stack_ffffffffffffbef8,
                                (int64_t)in_stack_ffffffffffffbef0);
                Fad<double>::operator+=
                          ((Fad<double> *)in_stack_ffffffffffffbf10,
                           (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                            *)in_stack_ffffffffffffbf08);
                FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                            *)in_stack_ffffffffffffbee0);
                FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
                          ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)
                           in_stack_ffffffffffffbee0);
              }
            }
            TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x166a803);
            TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x166a810);
            TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)0x166a81d);
            TPZManVector<Fad<double>,_3>::~TPZManVector
                      ((TPZManVector<Fad<double>,_3> *)in_stack_ffffffffffffbef0);
            local_27d0 = 0;
          }
          else {
            local_27d0 = 0x13;
          }
          TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)0x166a842);
          TPZManVector<Fad<double>,_3>::~TPZManVector
                    ((TPZManVector<Fad<double>,_3> *)in_stack_ffffffffffffbef0);
          TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)0x166a85c);
          TPZManVector<double,_3>::~TPZManVector(in_stack_ffffffffffffbee0);
          TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)0x166a876);
          TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)0x166a883);
          TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)0x166a890);
          TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)0x166a89d);
        }
        else {
          local_27d0 = 0x13;
        }
        TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)0x166a8aa);
        TPZManVector<Fad<double>,_3>::~TPZManVector
                  ((TPZManVector<Fad<double>,_3> *)in_stack_ffffffffffffbef0);
      }
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x166a8c4);
      TPZManVector<Fad<double>,_3>::~TPZManVector
                ((TPZManVector<Fad<double>,_3> *)in_stack_ffffffffffffbef0);
    }
    TPZFNMatrix<27,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<27,_Fad<double>_> *)0x166a9d7);
    TPZFNMatrix<27,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<27,_Fad<double>_> *)0x166a9e4);
    TPZFNMatrix<27,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<27,_Fad<double>_> *)0x166a9f1);
    TPZManVector<Fad<double>,_20>::~TPZManVector
              ((TPZManVector<Fad<double>,_20> *)in_stack_ffffffffffffbef0);
    TPZVec<TPZFMatrix<Fad<double>_>_>::~TPZVec
              ((TPZVec<TPZFMatrix<Fad<double>_>_> *)in_stack_ffffffffffffbf00);
    TPZVec<TPZFMatrix<Fad<double>_>_>::~TPZVec
              ((TPZVec<TPZFMatrix<Fad<double>_>_> *)in_stack_ffffffffffffbf00);
    TPZFNMatrix<45,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<45,_Fad<double>_> *)0x166aa25);
    TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)0x166aa32);
    TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)0x166aa3f);
  }
  else {
    TPZManVector<Fad<double>,_3>::TPZManVector
              (in_stack_ffffffffffffbf80,(int64_t)in_stack_ffffffffffffbf78);
    TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(in_stack_ffffffffffffbf30);
    bVar1 = MapToNeighSide<Fad<double>>
                      (in_stack_ffffffffffffc478,in_stack_ffffffffffffc474,in_stack_ffffffffffffc470
                       ,in_stack_ffffffffffffc468,in_stack_ffffffffffffc460,
                       (TPZFMatrix<Fad<double>_> *)
                       CONCAT44(in_stack_ffffffffffffc45c,in_stack_ffffffffffffc458));
    if (!bVar1) {
      pzinternal::DebugStopImpl(in_stack_ffffffffffffc300,in_stack_ffffffffffffc2f8);
    }
    TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(in_stack_ffffffffffffbf30);
    Neighbour(in_stack_ffffffffffffbef8,(int)((ulong)in_stack_ffffffffffffbef0 >> 0x20),
              in_stack_ffffffffffffbee8);
    TPZGeoElSide::GradX((TPZGeoElSide *)in_stack_ffffffffffffc460,
                        (TPZVec<Fad<double>_> *)
                        CONCAT44(in_stack_ffffffffffffc45c,in_stack_ffffffffffffc458),
                        in_stack_ffffffffffffc450);
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x16683c1);
    TPZMatrix<Fad<double>_>::Multiply
              ((TPZMatrix<Fad<double>_> *)in_stack_ffffffffffffbfc0,in_stack_ffffffffffffbfb8,
               in_stack_ffffffffffffbfb0,iVar2);
    TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)0x16683ef);
    TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)0x16683fc);
    TPZManVector<Fad<double>,_3>::~TPZManVector
              ((TPZManVector<Fad<double>,_3> *)in_stack_ffffffffffffbef0);
  }
  return;
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::GradX(TPZFMatrix<REAL> &coord, TPZVec<T> &xiInterior, TPZFMatrix<T> &gradx) const {

    TPZGeoEl &gel = *fGeoEl;
    TPZGeoMesh *gmesh = gel.Mesh();
#ifdef PZ_LOG
    const auto VAL_WIDTH = 10;
    std::ostringstream soutLogDebug;
    if(logger.isDebugEnabled())
    {   soutLogDebug<<"======================_______REF_1"<<std::endl;
        soutLogDebug << "TPZGeoBlend<" <<MElementType_Name(TGeo::Type())<<">::GradX"<<std::endl;
        soutLogDebug << "element id " <<gel.Id()<<std::endl;
        soutLogDebug << "xi: ";
        for(int i = 0; i < xiInterior.size(); i++) soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<xiInterior[i]<<"\t";
        soutLogDebug<<std::endl;
    }
#endif
    const REAL zero = 1e-14;
    gradx.Redim(3,TGeo::Dimension);

    if (fNeighbours[TGeo::NSides - 1 -TGeo::NNodes].ElementIndex() != -1){
        TPZManVector<T, 3> neighXi;
        TPZFNMatrix<9, T> dNeighXiDXi;
        if (!MapToNeighSide(TGeo::NSides-1, TGeo::Dimension, xiInterior, neighXi, dNeighXiDXi)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << xi << " and side " << TGeo::NSides-1 << ". Aborting...";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            DebugStop();
        }
        TPZFNMatrix<9, T> gradNeigh;
        Neighbour(TGeo::NSides-1, gmesh).GradX(neighXi, gradNeigh);
        gradNeigh.Multiply(dNeighXiDXi,gradx);//gradNonLinSide = gradNeigh.dNeighXiDXi
        return;
    }

    /**
     * The non-linear mapping is calculated from deviations of the linear mapping.
     * The linear mapping of an element (or of any of its side) can be calculated with the barycentric coordinates
     * of the nodes contained in it
     */
    TPZFNMatrix<9, T> phi(TGeo::NNodes, 1), dPhiDxi(TGeo::Dimension, TGeo::NNodes);
    TGeo::TShape(xiInterior, phi, dPhiDxi);//gets the barycentric coordinates


    TPZFNMatrix<45,T> gradXLin(3, TGeo::Dimension,(T)0);
    for (int iNode = 0; iNode < TGeo::NNodes; iNode++) {//calculates the linear mapping
        for(int x = 0; x < 3; x++) {
            for (int xi = 0; xi < TGeo::Dimension; xi++) {
                gradXLin(x, xi) += coord(x, iNode) * dPhiDxi(xi, iNode);
            }
        }
    }
    for(int i = 0; i < gradx.Rows(); i++){
        for(int j = 0; j < gradx.Cols(); j++){
            gradx(i,j) = gradXLin(i,j);
        }
    }

#ifdef PZ_LOG
    soutLogDebug<<"FIRST TERM"<<std::endl;
    soutLogDebug << "gradient of linear mapping:\n";
    if (logger.isDebugEnabled()) {
        for (int i = 0; i < gradXLin.Rows(); i++) {
            for (int j = 0; j < gradXLin.Cols(); j++) {
                soutLogDebug << std::setw(VAL_WIDTH) << std::right << gradXLin(i, j);
                if (j != gradXLin.Cols() - 1) soutLogDebug << "\t";
            }
            soutLogDebug << std::endl;
        }
    }

#endif
    /**
     * Now, the deviation for any non-linearity of the sides' mappings must be taken into account.
     */

    TPZVec<TPZFMatrix<T> > gradNonLinSideVec(TGeo::NSides - TGeo::NNodes,
                                             TPZFNMatrix<27,T>(3, TGeo::Dimension, 0));
    TPZVec<TPZFMatrix<T> > gradLinSideVec(TGeo::NSides - TGeo::NNodes,
                                          TPZFNMatrix<27,T>(3, TGeo::Dimension, 0));
    TPZManVector<T, 20> blendFactor(TGeo::NSides - TGeo::NNodes, (T)0);
    TPZFNMatrix<27,T> dCorrFactorDxi(TGeo::NSides - TGeo::NNodes, TGeo::Dimension, (T) 0);
    TPZFNMatrix<27, T> linearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    TPZFNMatrix<27, T> nonLinearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    for (int sideIndex = 0; sideIndex < TGeo::NSides - TGeo::NNodes - 1; sideIndex++) {
        TPZManVector<T, 3> xiProjectedOverSide(TGeo::Dimension, 0);
        TPZFMatrix<T> &gradNonLinSide = gradNonLinSideVec[sideIndex];
        TPZFMatrix<T> &gradLinSide = gradLinSideVec[sideIndex];
        gradLinSide.Redim(3,TGeo::Dimension);
        gradNonLinSide.Redim(3,TGeo::Dimension);

        int side = TGeo::NNodes + sideIndex;
        TPZGeoElSide gelside(fNeighbours[sideIndex], gmesh);
        #ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "================================" << std::endl;
            soutLogDebug << "side: " << side << " is linear: ";
        }
        #endif
        if (IsLinearMapping(side) || !gelside.Exists()) {
            blendFactor[sideIndex] = 0;
            #ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                if (IsLinearMapping(side)) soutLogDebug << "true" << std::endl;
                else soutLogDebug << "false (no gelside) " << std::endl;
            }
            #endif
            continue;
        }
        #ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "false (gelside exists) " << std::endl;
        }
        #endif
        /**
     * Calculates the linear mapping of the side sideIndex, and the projected point on sideIndex
     */
        TPZManVector<T, 3> sideXi;
        TPZFNMatrix<9, T> transfXiToSideXi;
        bool regularMap = TGeo::CheckProjectionForSingularity(side, xiInterior);
        if (!regularMap) {
            #ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "mapping is not regular. skipping side... ";

            }
            #endif
            continue;
        }

        this->MapToSide(side, xiInterior, sideXi, transfXiToSideXi);
        MElementType sideType = TGeo::Type(side);
        const int nSideNodes = MElementType_NNodes(sideType);
        const int sideDim = TGeo::SideDimension(side);
        TPZFNMatrix<9, T> sidePhiVec(nSideNodes, 1),
                dSidePhiDSideXiVec(sideDim, nSideNodes);
        GetSideShapeFunction<TGeo>(side, sideXi, sidePhiVec, dSidePhiDSideXiVec);

        TPZFNMatrix<9, T> dXprojDxiSide(TGeo::Dimension,sideDim,(T)0),
                dXiProjectedOverSideDxi(TGeo::Dimension,TGeo::Dimension,(T)0);
        TPZManVector<REAL, 3> nodeCoord;
        //calculation of transformation for the derivatives of sidephi
        
        TPZFNMatrix<9, T> gradLinSideXiSide(3,sideDim,(T)0);
        for (int iNode = 0; iNode < nSideNodes; iNode++) {
            const int currentNode = TGeo::SideNodeLocId(side, iNode);

            for (int x = 0; x < 3; x++) {
                linearSideMappings(sideIndex, x) +=
                        coord(x, currentNode) * sidePhiVec(iNode, 0);
            }

            TGeo::ParametricDomainNodeCoord(currentNode, nodeCoord);
            for (int x = 0; x < TGeo::Dimension; x++) {
                xiProjectedOverSide[x] += nodeCoord[x] * sidePhiVec(iNode, 0);
            }

            for(int x = 0; x < 3; x++){
                for(int xi = 0; xi < sideDim; xi++) {
                    gradLinSideXiSide(x,xi) += coord(x, currentNode) * dSidePhiDSideXiVec(xi,iNode);
                }
            }

            for (int i = 0; i < TGeo::Dimension; i++) {
                for (int j = 0; j < sideDim; j++) {
                    dXprojDxiSide(i,j) += nodeCoord[i] * dSidePhiDSideXiVec(j,iNode);
                }
            }

        }

        gradLinSideXiSide.Multiply(transfXiToSideXi,gradLinSide);//gradLinSideTemp = gradLinSideXiSide.transfXiToSideXi
        dXprojDxiSide.Multiply(transfXiToSideXi,dXiProjectedOverSideDxi);//dXprojDxiTemp = dXprojDxiSide.transfXiToSideXi

        #ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "xi projection over side: ";
            for (int x = 0; x < TGeo::Dimension; x++) soutLogDebug << xiProjectedOverSide[x] << "\t";
            soutLogDebug << "\nGrad of projected point to side:\n";
            for(int i = 0; i < dXiProjectedOverSideDxi.Rows(); i++){
                for(int j = 0; j < dXiProjectedOverSideDxi.Cols(); j++){
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<dXiProjectedOverSideDxi(i,j);
                    if(j != dXiProjectedOverSideDxi.Cols() - 1) soutLogDebug<<"\t";
                }
                soutLogDebug<<std::endl;
            }
            soutLogDebug << std::endl << "xi projection in side domain:";
            for (int x = 0; x < sideXi.size(); x++) soutLogDebug << sideXi[x] << "\t";
            soutLogDebug << "\nTransformation from x side to xi interior:\n";
            for(int i = 0; i < transfXiToSideXi.Rows(); i++){
                for(int j = 0; j < transfXiToSideXi.Cols(); j++){
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<transfXiToSideXi(i,j);
                    if(j != transfXiToSideXi.Cols() - 1) soutLogDebug<<"\t";
                }
                soutLogDebug<<std::endl;
            }
            soutLogDebug << std::endl << "\nLinear mapping of projected point: ";
            for (int x = 0; x < 3; x++) soutLogDebug << linearSideMappings(sideIndex, x) << "\t";
            soutLogDebug << "\nGrad of linear mapping of point projected to side:\n";
            for(int i = 0; i < gradLinSide.Rows(); i++){
                for(int j = 0; j < gradLinSide.Cols(); j++){
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<gradLinSide(i,j);
                    if(j != gradLinSide.Cols() - 1) soutLogDebug<<"\t";
                }
                soutLogDebug<<std::endl;
            }
        }
        #endif
        /**
         * Calculates the non-linear mapping of the side sideIndex
         */
        {
            TPZManVector<T,3> dCorrFactor(TGeo::Dimension,(T)0);
            TGeo::BlendFactorForSide(side, xiInterior, blendFactor[sideIndex], dCorrFactor);
            for(int iXi = 0; iXi < TGeo::Dimension; iXi++){
                dCorrFactorDxi(sideIndex,iXi) = dCorrFactor[iXi];
            }
        }

        int sidedim = gelside.Dimension();
        TPZManVector<T, 3> neighXi;
        TPZFNMatrix<9, T> dNeighXiDXi;
        if (!MapToNeighSide(side, sidedim, xiInterior, neighXi, dNeighXiDXi)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << par << " and side " << byside << " skipping the side ";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            continue;
        }
        TPZManVector<T, 3> Xside(3, 0.);
        Neighbour(side, gmesh).X(neighXi, Xside);
        TPZFNMatrix<9, T> gradNeigh;
        Neighbour(side, gmesh).GradX(neighXi,gradNeigh);
        for (int x = 0; x < 3; x++) {
            nonLinearSideMappings(sideIndex, x) = Xside[x];
        }
        gradNeigh.Multiply(dNeighXiDXi,gradNonLinSide);//gradNonLinSide = gradNeigh.dNeighXiDXi

//        else{
        TPZStack<int> containedNodesInSide;
        TGeo::LowerDimensionSides(side, containedNodesInSide, 0);

        TPZStack<int> allContainedSides;
        TGeo::LowerDimensionSides(side, allContainedSides);
        for (int subSideIndex = containedNodesInSide.NElements();
             subSideIndex < allContainedSides.NElements(); subSideIndex++) {
//            TPZFNMatrix<9, T> gradNonLinSubSide(3,TGeo::Dimension,(T)0);
            const int subSide = allContainedSides[subSideIndex];
#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside " << subSideIndex << " (global: " << subSide << ") is linear: ";
                if (IsLinearMapping(subSide)) soutLogDebug << "true" << std::endl;
                else soutLogDebug << "false" << std::endl;
            }
#endif
            if (IsLinearMapping(subSide)) continue;

            T blendFactorSide = -1;
            TPZManVector<T,3> dCorrFactorSideDxiProj(TGeo::Dimension,(T)0);
            TPZFNMatrix<3, T> dCorrFactorSideDxi(TGeo::Dimension,1,(T)0);
            TGeo::BlendFactorForSide(subSide, xiProjectedOverSide, blendFactorSide, dCorrFactorSideDxiProj);

#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside influence :" << blendFactorSide << std::endl;
            }
#endif
            TPZFNMatrix<3, T> dCorrFactorSideDxiProjMat(1,TGeo::Dimension,(T)0);
            for(int xi = 0; xi < TGeo::Dimension; xi++){
                dCorrFactorSideDxiProjMat(0,xi) = dCorrFactorSideDxiProj[xi];
            }

//                 dCorrFactorSideDxi = dXiProjectedOverSideDxi. dCorrFactorSideDxiProjMat
//                dXiProjectedOverSideDxi.Multiply(dCorrFactorSideDxiProjMat,dCorrFactorSideDxi);//mostrarphil

//                dCorrFactorSideDxi = dCorrFactorSideDxiProjMat . dXiProjectedOverSideDxi;
            dCorrFactorSideDxiProjMat.Multiply(dXiProjectedOverSideDxi,dCorrFactorSideDxi);
            #ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\n\tGrad of correction factor of point projected to side:\n";
                for(int i = 0; i < dCorrFactorSideDxi.Rows(); i++){
                    soutLogDebug<<"\t";
                    for(int j = 0; j < dCorrFactorSideDxi.Cols(); j++){
                        soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<dCorrFactorSideDxi(i,j);
                        if(j != dCorrFactorSideDxi.Cols() - 1) soutLogDebug<<"\t";
                    }
                    soutLogDebug<<std::endl;
                }
            }
            #endif
            TPZFMatrix<T> &gradNonLinSubSide = gradNonLinSideVec[subSide - TGeo::NNodes];
            TPZFMatrix<T> &gradLinSubSide = gradLinSideVec[subSide - TGeo::NNodes];
            for (int x = 0; x < 3; x++) {
                nonLinearSideMappings(sideIndex, x) -=
                        blendFactorSide *
                        (nonLinearSideMappings(subSide - TGeo::NNodes, x) -
                         linearSideMappings(subSide - TGeo::NNodes, x));
                for (int j = 0; j < TGeo::Dimension; j++) {
                    gradNonLinSide(x,j) -= blendFactorSide *  (gradNonLinSubSide(x,j)-gradLinSubSide(x,j));
                    gradNonLinSide(x,j) -= dCorrFactorSideDxi(0,j) *
                                           (nonLinearSideMappings(subSide - TGeo::NNodes, x) -
                                            linearSideMappings(subSide - TGeo::NNodes, x));
                }
            }
        }
//        }
#ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "Non-linear mapping: ";
            for (int x = 0; x < 3; x++) soutLogDebug << nonLinearSideMappings(sideIndex, x) << "\t";
            soutLogDebug << "\nGrad of non-linear mapping:\n";
            for(int i = 0; i < gradNonLinSide.Rows(); i++){
                for(int j = 0; j < gradNonLinSide.Cols(); j++){
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<gradNonLinSide(i,j);
                    if(j != gradNonLinSide.Cols() - 1) soutLogDebug<<"\t";
                }
                soutLogDebug<<std::endl;
            }
            soutLogDebug << std::endl;
            soutLogDebug << "adding to result mapping of side: " << side << std::endl;
            soutLogDebug << "\t\tcorrection factor: " << blendFactor[sideIndex] << std::endl;
            soutLogDebug << "\t\tdCorrFactorDxi: ";
            for(int i = 0; i < TGeo::Dimension; i++) soutLogDebug<<dCorrFactorDxi(sideIndex,i)<<"\t";
            soutLogDebug << "\n";

            soutLogDebug<<"SECOND TERM (SIDE "<<sideIndex<<") :"<<std::endl;
            soutLogDebug << "\t\tblendFactor *  (gradNonLinSide-gradLinSide): " << std::endl;
            for (int i = 0; i < 3; i++) {
                for (int j = 0; j < TGeo::Dimension; j++) {
                    const T val = blendFactor[sideIndex] *  (gradNonLinSide(i,j)-gradLinSide(i,j));
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<val;
                    if(j != TGeo::Dimension - 1) soutLogDebug<<"\t";
                }
                soutLogDebug << "\n";
            }
            soutLogDebug<<"THIRD TERM (SIDE "<<sideIndex<<") :"<<std::endl;
            soutLogDebug << "\t\tdCorrFactorDxi *\n"
                            "                              (nonLinearSideMappings -\n"
                            "                               linearSideMappings): " << std::endl;
            for (int i = 0; i < 3; i++) {
                for (int j = 0; j < TGeo::Dimension; j++) {
                    const T val = dCorrFactorDxi(sideIndex,j) *
                                  (nonLinearSideMappings(sideIndex, i) -
                                   linearSideMappings(sideIndex,i));
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<val;
                    if(j != TGeo::Dimension - 1) soutLogDebug<<"\t";
                }
                soutLogDebug << "\n";
            }

            soutLogDebug<<std::endl;
        }
#endif

        for (int i = 0; i < 3; i++) {
            for (int j = 0; j < TGeo::Dimension; j++) {
                gradx(i,j) += blendFactor[sideIndex] *  (gradNonLinSide(i,j)-gradLinSide(i,j));
                gradx(i,j) += dCorrFactorDxi(sideIndex,j) *
                              (nonLinearSideMappings(sideIndex, i) -
                               linearSideMappings(sideIndex,i));
            }
        }
    }
#ifdef PZ_LOG
    if(logger.isDebugEnabled()){
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "=============result=============" <<std::endl;
        soutLogDebug <<"================================"<<std::endl;
        for(int i = 0; i < gradx.Rows(); i++){
            for(int j = 0; j < gradx.Cols(); j++){
                soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<gradx(i,j);
                if(j != gradx.Cols() - 1) soutLogDebug<<"\t";
            }
            soutLogDebug<<std::endl;
        }
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        LOGPZ_DEBUG(logger,soutLogDebug.str())
        soutLogDebug.str("");
    }
#endif
#ifdef PZDEBUG
    for(int i = 0; i < gradx.Rows();i++){
        for(int j = 0; j < gradx.Cols(); j++) {
            if (std::isnan(TPZExtractVal::val(gradx(i,j)))) {
                DebugStop();
            }
        }
    }
#endif

}